

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

ssize_t __thiscall xmrig::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  int __fd_00;
  undefined4 in_register_00000034;
  uv_buf_t buf;
  undefined1 local_28 [16];
  
  __fd_00 = (int)local_28;
  iVar1 = (*(this->super_BaseClient).super_IClient._vptr_IClient[5])();
  if ((char)iVar1 == '\0') {
    if ((this->super_BaseClient).m_state != ConnectedState) {
      return -1;
    }
    iVar1 = uv_is_writable(this->m_stream);
    if (iVar1 == 0) {
      return -1;
    }
    local_28 = uv_buf_init(this->m_sendBuf,__fd);
    iVar1 = uv_try_write(this->m_stream,local_28,1);
    if (iVar1 < 0) {
      close(this,__fd_00);
      return -1;
    }
  }
  else {
    sVar2 = Tls::send(this->m_tls,(int)this + 0x280,(void *)CONCAT44(in_register_00000034,__fd),__n,
                      __flags);
    if ((char)sVar2 == '\0') {
      return -1;
    }
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  this->m_expire = lVar3 / 1000000 + 20000;
  lVar3 = BaseClient::m_sequence;
  BaseClient::m_sequence = BaseClient::m_sequence + 1;
  return lVar3;
}

Assistant:

int64_t xmrig::Client::send(size_t size)
{
    LOG_DEBUG("[%s] send (%d bytes): \"%.*s\"", url(), size, static_cast<int>(size) - 1, m_sendBuf);

#   ifdef XMRIG_FEATURE_TLS
    if (isTLS()) {
        if (!m_tls->send(m_sendBuf, size)) {
            return -1;
        }
    }
    else
#   endif
    {
        if (state() != ConnectedState || !uv_is_writable(m_stream)) {
            LOG_DEBUG_ERR("[%s] send failed, invalid state: %d", url(), m_state);
            return -1;
        }

        uv_buf_t buf = uv_buf_init(m_sendBuf, (unsigned int) size);

        if (uv_try_write(m_stream, &buf, 1) < 0) {
            close();
            return -1;
        }
    }

    m_expire = Chrono::steadyMSecs() + kResponseTimeout;
    return m_sequence++;
}